

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
itlib::small_vector<double,_4UL,_0UL,_std::allocator<double>_>::small_vector
          (small_vector<double,_4UL,_0UL,_std::allocator<double>_> *this,
          small_vector<double,_4UL,_0UL,_std::allocator<double>_> *v)

{
  small_vector<double,_4UL,_0UL,_std::allocator<double>_> *psVar1;
  double *pdVar2;
  small_vector<double,_4UL,_0UL,_std::allocator<double>_> *in_RSI;
  small_vector<double,_4UL,_0UL,_std::allocator<double>_> *in_RDI;
  pointer p;
  allocator<double> *in_stack_ffffffffffffffe0;
  small_vector<double,_4UL,_0UL,_std::allocator<double>_> *this_00;
  pointer local_18;
  
  get_alloc(in_RSI);
  Catch::clara::std::allocator<double>::allocator
            (in_stack_ffffffffffffffe0,(allocator<double> *)in_RDI);
  in_RDI->m_capacity = in_RSI->m_capacity;
  in_RDI->m_dynamic_capacity = in_RSI->m_dynamic_capacity;
  in_RDI->m_dynamic_data = in_RSI->m_dynamic_data;
  this_00 = (small_vector<double,_4UL,_0UL,_std::allocator<double>_> *)in_RSI->m_begin;
  psVar1 = (small_vector<double,_4UL,_0UL,_std::allocator<double>_> *)static_begin_ptr(in_RSI);
  if (this_00 == psVar1) {
    pdVar2 = static_begin_ptr(in_RDI);
    in_RDI->m_end = pdVar2;
    in_RDI->m_begin = pdVar2;
    for (local_18 = in_RSI->m_begin; local_18 != in_RSI->m_end; local_18 = local_18 + 1) {
      get_alloc(in_RDI);
      std::allocator_traits<std::allocator<double>>::construct<double,double>
                ((allocator_type *)this_00,(double *)in_RDI,(double *)0x1f6115);
      in_RDI->m_end = in_RDI->m_end + 1;
    }
    clear(this_00);
  }
  else {
    in_RDI->m_begin = in_RSI->m_begin;
    in_RDI->m_end = in_RSI->m_end;
  }
  in_RSI->m_dynamic_capacity = 0;
  in_RSI->m_dynamic_data = (pointer)0x0;
  pdVar2 = static_begin_ptr(in_RSI);
  in_RSI->m_end = pdVar2;
  in_RSI->m_begin = pdVar2;
  in_RSI->m_capacity = 4;
  return;
}

Assistant:

small_vector(small_vector&& v) noexcept
        : m_alloc(std::move(v.get_alloc()))
        , m_capacity(v.m_capacity)
        , m_dynamic_capacity(v.m_dynamic_capacity)
        , m_dynamic_data(v.m_dynamic_data)
    {
        if (v.m_begin == v.static_begin_ptr())
        {
            m_begin = m_end = static_begin_ptr();
            for (auto p = v.m_begin; p != v.m_end; ++p)
            {
                atraits::construct(get_alloc(), m_end, std::move(*p));
                ++m_end;
            }

            v.clear();
        }
        else
        {
            m_begin = v.m_begin;
            m_end = v.m_end;
        }

        v.m_dynamic_capacity = 0;
        v.m_dynamic_data = nullptr;
        v.m_begin = v.m_end = v.static_begin_ptr();
        v.m_capacity = StaticCapacity;
    }